

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O1

uint32_t pull_le32(uchar **cursor,size_t *max)

{
  ulong __n;
  uint32_t *__src;
  size_t sVar1;
  leint32_t lev;
  uint32_t local_1c;
  
  __n = *max;
  __src = (uint32_t *)*cursor;
  if (__n < 4) {
    memcpy(&local_1c,__src,__n);
    sVar1 = 0;
    memset((void *)((long)&local_1c + __n),0,4 - __n);
    *cursor = (uchar *)0x0;
  }
  else {
    local_1c = *__src;
    *cursor = (uchar *)(__src + 1);
    sVar1 = __n - 4;
  }
  *max = sVar1;
  return local_1c;
}

Assistant:

uint32_t pull_le32(const unsigned char **cursor, size_t *max)
{
    leint32_t lev;
    pull_bytes(&lev, sizeof(lev), cursor, max);
    return le32_to_cpu(lev);
}